

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddAsmJsModuleInfo
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  undefined4 value;
  undefined1 value_00;
  ModuleFunctionImport MVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  PropertyId PVar8;
  RegSlot value_01;
  int iVar9;
  uint value_02;
  AsmJsModuleInfo *this_00;
  PropertyIdArray *pPVar10;
  RegSlot *buffer;
  ModuleVar *value_03;
  ModuleVarImport *pMVar11;
  ModuleFunctionImport *pMVar12;
  ModuleFunction *pMVar13;
  ModuleFunctionTable *pMVar14;
  uint **ppuVar15;
  AsmJsModuleMemory *value_04;
  AsmJsSlotMap *pAVar16;
  AsmJsSlot **ppAVar17;
  BVStatic<16UL> local_c0;
  BVStatic<32UL> local_b8;
  PropertyId local_ac;
  undefined1 local_a8 [4];
  PropertyId propertyId_3;
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  slotIter;
  ModuleFunctionTable table;
  int i_5;
  ModuleFunction func;
  int i_4;
  PropertyId propertyId_2;
  ModuleFunctionImport import_1;
  int i_3;
  PropertyId propertyId_1;
  ModuleVarImport import;
  int i_2;
  int i_1;
  PropertyId propertyId;
  uint i;
  PropertyIdArray *propArray;
  AsmJsModuleInfo *moduleInfo;
  uint32 size;
  FunctionBody *function_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  this_00 = FunctionBody::GetAsmJsModuleInfo(function);
  iVar3 = AsmJsModuleInfo::GetArgInCount(this_00);
  uVar4 = PrependInt32(this,builder,L"ArgInCount",iVar3,(BufferBuilderInt32 **)0x0);
  iVar3 = AsmJsModuleInfo::GetExportsCount(this_00);
  uVar5 = PrependInt32(this,builder,L"ExportsCount",iVar3,(BufferBuilderInt32 **)0x0);
  iVar3 = AsmJsModuleInfo::GetSlotsCount(this_00);
  uVar6 = PrependInt32(this,builder,L"SlotsCount",iVar3,(BufferBuilderInt32 **)0x0);
  moduleInfo._4_4_ = uVar6 + uVar5 + uVar4;
  iVar3 = AsmJsModuleInfo::GetExportsCount(this_00);
  if (0 < iVar3) {
    pPVar10 = AsmJsModuleInfo::GetExportsIdArray(this_00);
    uVar4 = PrependByte(this,builder,L"ExtraSlotsCount",pPVar10->extraSlots);
    uVar5 = PrependByte(this,builder,L"ExportsIdArrayDups",pPVar10->hadDuplicates & 1);
    uVar6 = PrependByte(this,builder,L"ExportsIdArray__proto__",pPVar10->has__proto__ & 1);
    uVar7 = PrependInt32(this,builder,L"ExportsIdArrayLength",pPVar10->count,
                         (BufferBuilderInt32 **)0x0);
    moduleInfo._4_4_ = uVar7 + uVar6 + uVar5 + uVar4 + moduleInfo._4_4_;
    for (i_1 = 0; (uint)i_1 < pPVar10->count; i_1 = i_1 + 1) {
      PVar8 = encodePossiblyBuiltInPropertyId(this,(&pPVar10[1].count)[(uint)i_1]);
      uVar4 = PrependInt32(this,builder,L"ExportsIdArrayElem",PVar8,(BufferBuilderInt32 **)0x0);
      moduleInfo._4_4_ = uVar4 + moduleInfo._4_4_;
    }
    iVar3 = AsmJsModuleInfo::GetExportsCount(this_00);
    buffer = AsmJsModuleInfo::GetExportsFunctionLocation(this_00);
    uVar4 = PrependUInt32Array(this,builder,iVar3,buffer);
    moduleInfo._4_4_ = uVar4 + moduleInfo._4_4_;
  }
  value_01 = AsmJsModuleInfo::GetExportFunctionIndex(this_00);
  uVar4 = PrependInt32(this,builder,L"ExportFunctionIndex",value_01,(BufferBuilderInt32 **)0x0);
  iVar3 = AsmJsModuleInfo::GetVarCount(this_00);
  uVar5 = PrependInt32(this,builder,L"VarCount",iVar3,(BufferBuilderInt32 **)0x0);
  moduleInfo._4_4_ = uVar5 + uVar4 + moduleInfo._4_4_;
  import.field = 0;
  while( true ) {
    iVar3 = AsmJsModuleInfo::GetVarCount(this_00);
    if (iVar3 <= import.field) break;
    value_03 = AsmJsModuleInfo::GetVar(this_00,import.field);
    uVar4 = PrependStruct<Js::AsmJsModuleInfo::ModuleVar>(this,builder,L"ModuleVar",value_03);
    moduleInfo._4_4_ = uVar4 + moduleInfo._4_4_;
    import.field = import.field + 1;
  }
  iVar3 = AsmJsModuleInfo::GetVarImportCount(this_00);
  uVar4 = PrependInt32(this,builder,L"VarImportCount",iVar3,(BufferBuilderInt32 **)0x0);
  moduleInfo._4_4_ = uVar4 + moduleInfo._4_4_;
  import.type = Int;
  import._5_3_ = 0;
  while( true ) {
    iVar3 = AsmJsModuleInfo::GetVarImportCount(this_00);
    if (iVar3 <= (int)import._4_4_) break;
    pMVar11 = AsmJsModuleInfo::GetVarImport(this_00,import._4_4_);
    value = pMVar11->location;
    value_00 = pMVar11->type;
    PVar8 = pMVar11->field;
    uVar4 = PrependInt32(this,builder,L"ImportLocation",value,(BufferBuilderInt32 **)0x0);
    uVar5 = PrependByte(this,builder,L"ImportType",value_00);
    PVar8 = encodePossiblyBuiltInPropertyId(this,PVar8);
    uVar6 = PrependInt32(this,builder,L"ImportId",PVar8,(BufferBuilderInt32 **)0x0);
    moduleInfo._4_4_ = uVar6 + uVar5 + uVar4 + moduleInfo._4_4_;
    import._4_4_ = import._4_4_ + 1;
  }
  iVar3 = AsmJsModuleInfo::GetFunctionImportCount(this_00);
  uVar4 = PrependInt32(this,builder,L"FunctionImportCount",iVar3,(BufferBuilderInt32 **)0x0);
  moduleInfo._4_4_ = uVar4 + moduleInfo._4_4_;
  import_1.location = 0;
  while( true ) {
    iVar3 = AsmJsModuleInfo::GetFunctionImportCount(this_00);
    if (iVar3 <= (int)import_1.location) break;
    pMVar12 = AsmJsModuleInfo::GetFunctionImport(this_00,import_1.location);
    MVar1 = *pMVar12;
    i_4 = MVar1.location;
    uVar4 = PrependInt32(this,builder,L"ImportLocation",i_4,(BufferBuilderInt32 **)0x0);
    propertyId_2 = MVar1.field;
    PVar8 = encodePossiblyBuiltInPropertyId(this,propertyId_2);
    uVar5 = PrependInt32(this,builder,L"ImportId",PVar8,(BufferBuilderInt32 **)0x0);
    moduleInfo._4_4_ = uVar5 + uVar4 + moduleInfo._4_4_;
    import_1.location = import_1.location + 1;
  }
  iVar3 = AsmJsModuleInfo::GetFunctionCount(this_00);
  uVar4 = PrependInt32(this,builder,L"FunctionCount",iVar3,(BufferBuilderInt32 **)0x0);
  moduleInfo._4_4_ = uVar4 + moduleInfo._4_4_;
  i_5 = 0;
  while( true ) {
    iVar3 = AsmJsModuleInfo::GetFunctionCount(this_00);
    if (iVar3 <= i_5) break;
    pMVar13 = AsmJsModuleInfo::GetFunction(this_00,i_5);
    uVar4 = PrependInt32(this,builder,L"FuncLocation",pMVar13->location,(BufferBuilderInt32 **)0x0);
    moduleInfo._4_4_ = uVar4 + moduleInfo._4_4_;
    i_5 = i_5 + 1;
  }
  iVar3 = AsmJsModuleInfo::GetFunctionTableCount(this_00);
  uVar4 = PrependInt32(this,builder,L"FunctionTableCount",iVar3,(BufferBuilderInt32 **)0x0);
  moduleInfo._4_4_ = uVar4 + moduleInfo._4_4_;
  table.moduleFunctionIndex.ptr._4_4_ = 0;
  while( true ) {
    iVar3 = table.moduleFunctionIndex.ptr._4_4_;
    iVar9 = AsmJsModuleInfo::GetFunctionTableCount(this_00);
    if (iVar9 <= iVar3) break;
    pMVar14 = AsmJsModuleInfo::GetFunctionTable(this_00,table.moduleFunctionIndex.ptr._4_4_);
    AsmJsModuleInfo::ModuleFunctionTable::ModuleFunctionTable
              ((ModuleFunctionTable *)
               &slotIter.
                super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                .usedEntryCount,pMVar14);
    uVar4 = PrependInt32(this,builder,L"FuncTableSize",
                         slotIter.
                         super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                         .usedEntryCount,(BufferBuilderInt32 **)0x0);
    iVar3 = slotIter.
            super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
            .usedEntryCount;
    moduleInfo._4_4_ = uVar4 + moduleInfo._4_4_;
    ppuVar15 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__((WriteBarrierPtr *)&table);
    PrependUInt32Array(this,builder,iVar3,*ppuVar15);
    table.moduleFunctionIndex.ptr._4_4_ = table.moduleFunctionIndex.ptr._4_4_ + 1;
  }
  value_04 = AsmJsModuleInfo::GetModuleMemory(this_00);
  uVar4 = PrependStruct<Js::AsmJsModuleMemory>(this,builder,L"ModuleMemory",value_04);
  pAVar16 = AsmJsModuleInfo::GetAsmJsSlotMap(this_00);
  iVar3 = JsUtil::
          BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(pAVar16);
  uVar5 = PrependInt32(this,builder,L"AsmJsSlotMapCount",iVar3,(BufferBuilderInt32 **)0x0);
  moduleInfo._4_4_ = uVar5 + uVar4 + moduleInfo._4_4_;
  pAVar16 = AsmJsModuleInfo::GetAsmJsSlotMap(this_00);
  JsUtil::
  BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::GetIterator((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 *)local_a8,pAVar16);
  while( true ) {
    bVar2 = JsUtil::
            BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)local_a8);
    if (!bVar2) break;
    iVar3 = JsUtil::
            BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
            ::CurrentKey((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                          *)local_a8);
    local_ac = encodePossiblyBuiltInPropertyId(this,iVar3);
    uVar4 = PrependInt32(this,builder,L"AsmJsSlotPropId",local_ac,(BufferBuilderInt32 **)0x0);
    ppAVar17 = JsUtil::
               BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::
               IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
               ::CurrentValue((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                               *)local_a8);
    uVar5 = PrependStruct<Js::AsmJsSlot>(this,builder,L"AsmJsSlotValue",*ppAVar17);
    moduleInfo._4_4_ = uVar5 + uVar4 + moduleInfo._4_4_;
    JsUtil::
    BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_a8);
  }
  local_b8 = AsmJsModuleInfo::GetAsmMathBuiltinUsed(this_00);
  uVar4 = PrependStruct<BVStatic<32ul>>(this,builder,L"MathBuiltinBV",&local_b8);
  local_c0 = AsmJsModuleInfo::GetAsmArrayBuiltinUsed(this_00);
  uVar5 = PrependStruct<BVStatic<16ul>>(this,builder,L"ArrayBuiltinBV",&local_c0);
  value_02 = AsmJsModuleInfo::GetMaxHeapAccess(this_00);
  uVar6 = PrependInt32(this,builder,L"MaxHeapAccess",value_02,(BufferBuilderInt32 **)0x0);
  return uVar6 + uVar5 + uVar4 + moduleInfo._4_4_;
}

Assistant:

uint32 AddAsmJsModuleInfo(BufferBuilderList & builder, FunctionBody * function)
    {
        uint32 size = 0;
        AsmJsModuleInfo * moduleInfo = function->GetAsmJsModuleInfo();

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start Asm.js Module Info"), magicStartOfAsmJsModuleInfo);
#endif

        size += PrependInt32(builder, _u("ArgInCount"), moduleInfo->GetArgInCount());
        size += PrependInt32(builder, _u("ExportsCount"), moduleInfo->GetExportsCount());
        size += PrependInt32(builder, _u("SlotsCount"), moduleInfo->GetSlotsCount());

        if (moduleInfo->GetExportsCount() > 0)
        {
            PropertyIdArray * propArray = moduleInfo->GetExportsIdArray();
            size += PrependByte(builder, _u("ExtraSlotsCount"), propArray->extraSlots);
            size += PrependByte(builder, _u("ExportsIdArrayDups"), propArray->hadDuplicates);
            size += PrependByte(builder, _u("ExportsIdArray__proto__"), propArray->has__proto__);
            size += PrependInt32(builder, _u("ExportsIdArrayLength"), propArray->count);
            for (uint i = 0; i < propArray->count; i++)
            {
                PropertyId propertyId = encodePossiblyBuiltInPropertyId(propArray->elements[i]);
                size += PrependInt32(builder, _u("ExportsIdArrayElem"), propertyId);
            }
            size += PrependUInt32Array(builder, moduleInfo->GetExportsCount(), moduleInfo->GetExportsFunctionLocation());
        }

        size += PrependInt32(builder, _u("ExportFunctionIndex"), moduleInfo->GetExportFunctionIndex());

        size += PrependInt32(builder, _u("VarCount"), moduleInfo->GetVarCount());
        for (int i = 0; i < moduleInfo->GetVarCount(); i++)
        {
            size += PrependStruct(builder, _u("ModuleVar"), &moduleInfo->GetVar(i));
        }

        size += PrependInt32(builder, _u("VarImportCount"), moduleInfo->GetVarImportCount());
        for (int i = 0; i < moduleInfo->GetVarImportCount(); i++)
        {
            auto import = moduleInfo->GetVarImport(i);
            size += PrependInt32(builder, _u("ImportLocation"), import.location);
            size += PrependByte(builder, _u("ImportType"), import.type);
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(import.field);
            size += PrependInt32(builder, _u("ImportId"), propertyId);
        }

        size += PrependInt32(builder, _u("FunctionImportCount"), moduleInfo->GetFunctionImportCount());
        for (int i = 0; i < moduleInfo->GetFunctionImportCount(); i++)
        {
            auto import = moduleInfo->GetFunctionImport(i);
            size += PrependInt32(builder, _u("ImportLocation"), import.location);
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(import.field);
            size += PrependInt32(builder, _u("ImportId"), propertyId);
        }

        size += PrependInt32(builder, _u("FunctionCount"), moduleInfo->GetFunctionCount());
        for (int i = 0; i < moduleInfo->GetFunctionCount(); i++)
        {
            auto func = moduleInfo->GetFunction(i);
            size += PrependInt32(builder, _u("FuncLocation"), func.location);
        }

        size += PrependInt32(builder, _u("FunctionTableCount"), moduleInfo->GetFunctionTableCount());
        for (int i = 0; i < moduleInfo->GetFunctionTableCount(); i++)
        {
            auto table = moduleInfo->GetFunctionTable(i);
            size += PrependInt32(builder, _u("FuncTableSize"), table.size);
            PrependUInt32Array(builder, table.size, table.moduleFunctionIndex);
        }

        size += PrependStruct<AsmJsModuleMemory>(builder, _u("ModuleMemory"), &moduleInfo->GetModuleMemory());

        size += PrependInt32(builder, _u("AsmJsSlotMapCount"), moduleInfo->GetAsmJsSlotMap()->Count());
        auto slotIter = moduleInfo->GetAsmJsSlotMap()->GetIterator();
        while (slotIter.IsValid())
        {
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(slotIter.CurrentKey());
            size += PrependInt32(builder, _u("AsmJsSlotPropId"), propertyId);
            size += PrependStruct(builder, _u("AsmJsSlotValue"), slotIter.CurrentValue());
            slotIter.MoveNext();
        }
        size += PrependStruct(builder, _u("MathBuiltinBV"), &moduleInfo->GetAsmMathBuiltinUsed());
        size += PrependStruct(builder, _u("ArrayBuiltinBV"), &moduleInfo->GetAsmArrayBuiltinUsed());

        size += PrependInt32(builder, _u("MaxHeapAccess"), moduleInfo->GetMaxHeapAccess());

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Asm.js Module Info"), magicEndOfAsmJsModuleInfo);
#endif
        return size;
    }